

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::SampledGrid<pbrt::RGB>::SampledGrid
          (SampledGrid<pbrt::RGB> *this,span<const_pbrt::RGB> v,int nx,int ny,int nz,Allocator alloc
          )

{
  int iVar1;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *this_00;
  char (*args_1) [14];
  int in_ECX;
  int *in_RDX;
  RGB *in_RSI;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  char (*unaff_retaddr) [14];
  unsigned_long *in_stack_00000008;
  size_t vb;
  int va;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff68;
  polymorphic_allocator<pbrt::RGB> *in_stack_ffffffffffffff70;
  polymorphic_allocator<pbrt::RGB> *in_stack_ffffffffffffff78;
  RGB *in_stack_ffffffffffffff80;
  RGB *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *pvVar2;
  LogLevel level;
  
  pvVar2 = in_RDI;
  this_00 = (vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *)
            pstd::span<const_pbrt::RGB>::begin((span<const_pbrt::RGB> *)&stack0xfffffffffffffff0);
  level = (LogLevel)((ulong)pvVar2 >> 0x20);
  pstd::span<const_pbrt::RGB>::end((span<const_pbrt::RGB> *)&stack0xfffffffffffffff0);
  pstd::pmr::polymorphic_allocator<pbrt::RGB>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pstd::vector<pbrt::RGB,pstd::pmr::polymorphic_allocator<pbrt::RGB>>::vector<pbrt::RGB_const*>
            (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(int *)&in_RDI[1].alloc.memoryResource = in_ECX;
  *(int *)((long)&in_RDI[1].alloc.memoryResource + 4) = in_R8D;
  *(int *)&in_RDI[1].ptr = in_R9D;
  iVar1 = in_ECX * in_R8D * in_R9D;
  args_1 = (char (*) [14])
           pstd::vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::size(in_RDI);
  if ((char (*) [14])(long)iVar1 != args_1) {
    LogFatal<char_const(&)[13],char_const(&)[14],char_const(&)[13],int&,char_const(&)[14],unsigned_long&>
              (level,(char *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffc8,
               (char (*) [13])CONCAT44(iVar1,in_stack_ffffffffffffffc0),args_1,(char (*) [13])in_RSI
               ,in_RDX,unaff_retaddr,in_stack_00000008);
  }
  return;
}

Assistant:

SampledGrid(pstd::span<const T> v, int nx, int ny, int nz, Allocator alloc)
        : values(v.begin(), v.end(), alloc), nx(nx), ny(ny), nz(nz) {
        CHECK_EQ(nx * ny * nz, values.size());
    }